

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O3

void __thiscall NJamSpell::TPerfectHash::Load(TPerfectHash *this,istream *in)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  Clear(this);
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  this->Phf = puVar1;
  std::istream::read((char *)in,(long)(puVar1 + 4));
  std::istream::read((char *)in,(long)(puVar1 + 5));
  std::istream::read((char *)in,(long)(puVar1 + 2));
  std::istream::read((char *)in,(long)(puVar1 + 1));
  std::istream::read((char *)in,(long)puVar1 + 4);
  std::istream::read((char *)in,(long)puVar1);
  pvVar2 = calloc(puVar1[1],4);
  puVar1[3] = pvVar2;
  std::istream::read((char *)in,(long)pvVar2);
  return;
}

Assistant:

void TPerfectHash::Load(std::istream& in) {
    Clear();
    Phf = new phf();
    phf& perfHash = *(phf*)Phf;
    NHandyPack::Load(in, perfHash.d_max,
                        perfHash.g_op,
                        perfHash.m,
                        perfHash.r,
                        perfHash.seed,
                        perfHash.nodiv);
    perfHash.g = (uint32_t*)calloc(perfHash.r, sizeof(uint32_t));
    in.read((char*)perfHash.g, perfHash.r * sizeof(uint32_t));
}